

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utility.cpp
# Opt level: O0

INTN findPattern(UINT8 *pattern,UINT8 *patternMask,UINTN patternSize,UINT8 *data,UINTN dataSize,
                UINTN dataOff)

{
  bool bVar1;
  ulong local_50;
  UINTN i;
  UINTN UStack_40;
  bool matches;
  UINTN dataOff_local;
  UINTN dataSize_local;
  UINT8 *data_local;
  UINTN patternSize_local;
  UINT8 *patternMask_local;
  UINT8 *pattern_local;
  
  if ((((patternSize != 0) && (dataSize != 0)) && (dataOff < dataSize)) &&
     (UStack_40 = dataOff, patternSize <= dataSize - dataOff)) {
    for (; UStack_40 + patternSize <= dataSize; UStack_40 = UStack_40 + 1) {
      bVar1 = true;
      for (local_50 = 0; local_50 < patternSize; local_50 = local_50 + 1) {
        if ((data[UStack_40 + local_50] & patternMask[local_50]) != pattern[local_50]) {
          bVar1 = false;
          break;
        }
      }
      if (bVar1) {
        return UStack_40;
      }
    }
  }
  return -1;
}

Assistant:

INTN findPattern(const UINT8 *pattern, const UINT8 *patternMask, UINTN patternSize,
                 const UINT8 *data, UINTN dataSize, UINTN dataOff)
{
    if (patternSize == 0 || dataSize == 0 || dataOff >= dataSize || dataSize - dataOff < patternSize)
        return -1;
    
    while (dataOff + patternSize <= dataSize) {
        bool matches = true;
        for (UINTN i = 0; i < patternSize; i++) {
            if ((data[dataOff + i] & patternMask[i]) != pattern[i]) {
                matches = false;
                break;
            }
        }
        
        if (matches)
            return static_cast<INTN>(dataOff);
        
        dataOff++;
    }
    
    return -1;
}